

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS ref_interp_locate_node(REF_INTERP ref_interp,REF_INT node)

{
  int iVar1;
  int iVar2;
  REF_MPI pRVar3;
  REF_INT *pRVar4;
  REF_AGENTS ref_agents;
  REF_AGENT_STRUCT *pRVar5;
  REF_DBL *pRVar6;
  REF_CELL pRVar7;
  REF_INTERP ref_interp_00;
  REF_NODE pRVar8;
  uint uVar9;
  REF_INT *pRVar10;
  undefined8 uVar11;
  ulong uVar12;
  char *pcVar13;
  long lVar14;
  REF_INT *pRVar15;
  REF_INT id;
  REF_LIST ref_list;
  int local_4c;
  REF_INT *local_48;
  REF_LIST local_40;
  REF_NODE local_38;
  
  if (ref_interp == (REF_INTERP)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x74f,
           "ref_interp_locate_node","ref_interp NULL");
    return 2;
  }
  if (ref_interp->max < node) {
    pcVar13 = "more nodes added, should move only";
    uVar11 = 0x752;
    goto LAB_001564ce;
  }
  pRVar10 = ref_interp->cell;
  if (pRVar10[node] == -1) {
    return 0;
  }
  pRVar3 = ref_interp->ref_mpi;
  pRVar4 = ref_interp->part;
  if (pRVar3->id != pRVar4[node]) {
    return 0;
  }
  ref_agents = ref_interp->ref_agents;
  uVar12 = (ulong)ref_agents->n;
  if (uVar12 != 0) {
    pcVar13 = "did not expect active agents";
    uVar11 = 0x75b;
    lVar14 = 0;
LAB_00156571:
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar11
           ,"ref_interp_locate_node",pcVar13,lVar14,uVar12);
    return 1;
  }
  local_38 = ref_interp->to_grid->node;
  ref_interp->agent_hired[node] = 1;
  pRVar15 = (REF_INT *)((long)(node * 0xf) * 8);
  uVar9 = ref_agents_push(ref_agents,node,pRVar4[node],pRVar10[node],local_38->real + node * 0xf,
                          &local_4c);
  if (uVar9 == 0) {
    uVar12 = (ulong)ref_agents->agent[local_4c].mode;
    local_48 = pRVar15;
    if (uVar12 != 1) {
      pcVar13 = "should be walking";
      lVar14 = 1;
      uVar11 = 0x762;
      goto LAB_00156571;
    }
    uVar9 = ref_interp_walk_agent(ref_interp,local_4c);
    if (uVar9 == 0) {
      pRVar5 = ref_agents->agent;
      if (pRVar5[local_4c].mode == REF_AGENT_ENCLOSING) {
        pRVar10 = ref_interp->cell;
        pRVar10[node] = pRVar5[local_4c].seed;
        pRVar4 = ref_interp->part;
        pRVar4[node] = pRVar5[local_4c].part;
        pRVar6 = ref_interp->bary;
        lVar14 = 0;
        do {
          pRVar6[node * 4 + lVar14] = pRVar5[local_4c].bary[lVar14];
          lVar14 = lVar14 + 1;
        } while (lVar14 != 4);
        ref_interp->walk_steps = pRVar5[local_4c].step + ref_interp->walk_steps + 1;
        ref_interp->n_walk = ref_interp->n_walk + 1;
        iVar1 = pRVar3->id;
        lVar14 = (long)iVar1;
        iVar2 = pRVar4[node];
        uVar12 = (ulong)iVar2;
        if (iVar1 != iVar2) {
          pcVar13 = "expected local";
          uVar11 = 0x76b;
          goto LAB_00156571;
        }
        iVar1 = pRVar10[node];
        if (ref_interp->from_grid->twod == 0) {
          if (((iVar1 < 0) || (pRVar7 = ref_interp->from_tet, pRVar7->max <= iVar1)) ||
             (pRVar7->c2n[(long)pRVar7->size_per * (long)iVar1] == -1)) {
            pcVar13 = "expected a valid tet";
            uVar11 = 0x773;
            goto LAB_001564ce;
          }
        }
        else if (((iVar1 < 0) || (pRVar7 = ref_interp->from_tri, pRVar7->max <= iVar1)) ||
                (pRVar7->c2n[(long)pRVar7->size_per * (long)iVar1] == -1)) {
          pcVar13 = "expected a valid tri";
          uVar11 = 0x76f;
LAB_001564ce:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 uVar11,"ref_interp_locate_node",pcVar13);
          return 1;
        }
      }
      else {
        ref_interp->cell[node] = -1;
      }
      ref_interp->agent_hired[node] = 0;
      uVar9 = ref_agents_remove(ref_agents,local_4c);
      pRVar8 = local_38;
      if (uVar9 == 0) {
        pRVar10 = ref_interp->cell;
        if ((1 < local_38->ref_mpi->n) || (pRVar10[node] != -1)) {
LAB_00156807:
          return (uint)(pRVar10[node] == -1) * 5;
        }
        uVar9 = ref_list_create(&local_40);
        if (uVar9 == 0) {
          uVar9 = ref_search_touching(ref_interp->ref_search,local_40,
                                      (REF_DBL *)((long)pRVar8->real + (long)local_48),
                                      ref_interp->search_fuzz);
          if (uVar9 == 0) {
            if (0 < local_40->n) {
              local_48 = (REF_INT *)((long)local_48 + (long)local_38->real);
              ref_interp_00 = (REF_INTERP)ref_interp->from_grid->node;
              if (ref_interp->from_grid->twod == 0) {
                uVar9 = ref_interp_enclosing_tet_in_list
                                  (ref_interp_00,(REF_LIST)ref_interp->from_tet,(REF_DBL *)local_40,
                                   local_48,(REF_DBL *)(ref_interp->cell + node));
                if (uVar9 != 0) {
                  pcVar13 = "best tet in list";
                  uVar11 = 0x790;
                  goto LAB_001565ea;
                }
              }
              else {
                uVar9 = ref_interp_enclosing_tri_in_list
                                  (ref_interp_00,(REF_LIST)ref_interp->from_tri,(REF_DBL *)local_40,
                                   local_48,(REF_DBL *)(ref_interp->cell + node));
                if (uVar9 != 0) {
                  pcVar13 = "best tri in list";
                  uVar11 = 0x78b;
                  goto LAB_001565ea;
                }
              }
            }
            uVar9 = ref_list_free(local_40);
            if (uVar9 == 0) {
              pRVar10 = ref_interp->cell;
              goto LAB_00156807;
            }
            pcVar13 = "free list";
            uVar11 = 0x793;
          }
          else {
            pcVar13 = "tch";
            uVar11 = 0x785;
          }
        }
        else {
          pcVar13 = "create list";
          uVar11 = 0x781;
        }
      }
      else {
        pcVar13 = "no longer needed";
        uVar11 = 0x77b;
      }
    }
    else {
      pcVar13 = "walking";
      uVar11 = 0x763;
    }
  }
  else {
    pcVar13 = "requeue";
    uVar11 = 0x761;
  }
LAB_001565ea:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar11,
         "ref_interp_locate_node",(ulong)uVar9,pcVar13);
  return uVar9;
}

Assistant:

REF_FCN REF_STATUS ref_interp_locate_node(REF_INTERP ref_interp, REF_INT node) {
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_AGENTS ref_agents;
  REF_INT i, id;
  RNS(ref_interp, "ref_interp NULL");
  ref_mpi = ref_interp_mpi(ref_interp);

  RAS(node <= ref_interp_max(ref_interp), "more nodes added, should move only");

  /* no starting guess, skip */
  if (REF_EMPTY == ref_interp->cell[node] ||
      ref_mpi_rank(ref_mpi) != ref_interp->part[node])
    return REF_SUCCESS;

  ref_node = ref_grid_node(ref_interp_to_grid(ref_interp));
  ref_agents = ref_interp->ref_agents;
  REIS(0, ref_agents_n(ref_agents), "did not expect active agents");

  ref_interp->agent_hired[node] = REF_TRUE;
  RSS(ref_agents_push(ref_agents, node, ref_interp->part[node],
                      ref_interp->cell[node], ref_node_xyz_ptr(ref_node, node),
                      &id),
      "requeue");
  REIS(REF_AGENT_WALKING, ref_agent_mode(ref_agents, id), "should be walking");
  RSS(ref_interp_walk_agent(ref_interp, id), "walking");
  if (REF_AGENT_ENCLOSING == ref_agent_mode(ref_agents, id)) {
    ref_interp->cell[node] = ref_agent_seed(ref_agents, id);
    ref_interp->part[node] = ref_agent_part(ref_agents, id);
    for (i = 0; i < 4; i++)
      ref_interp->bary[i + 4 * node] = ref_agent_bary(ref_agents, i, id);
    (ref_interp->walk_steps) += (ref_agent_step(ref_agents, id) + 1);
    (ref_interp->n_walk)++;
    REIS(ref_mpi_rank(ref_mpi), ref_interp->part[node], "expected local");
    if (ref_grid_twod(ref_interp_from_grid(ref_interp))) {
      RAS(ref_cell_valid(ref_interp_from_tri(ref_interp),
                         ref_interp->cell[node]),
          "expected a valid tri");
    } else {
      RAS(ref_cell_valid(ref_interp_from_tet(ref_interp),
                         ref_interp->cell[node]),
          "expected a valid tet");
    }
  } else {
    /* new seed or go exhaustive for REF_AGENT_AT_BOUNDARY */
    /* what for parallel REF_AGENT_HOP_PART */
    ref_interp->cell[node] = REF_EMPTY;
  }
  ref_interp->agent_hired[node] = REF_FALSE; /* dismissed */
  RSS(ref_agents_remove(ref_agents, id), "no longer needed");

  if (!ref_mpi_para(ref_node_mpi(ref_node)) &&
      REF_EMPTY == ref_interp->cell[node]) {
    REF_LIST ref_list;

    RSS(ref_list_create(&ref_list), "create list");
    RSS(ref_search_touching(ref_interp_search(ref_interp), ref_list,
                            ref_node_xyz_ptr(ref_node, node),
                            ref_interp_search_fuzz(ref_interp)),
        "tch");
    if (ref_list_n(ref_list) > 0) {
      if (ref_grid_twod(ref_interp_from_grid(ref_interp))) {
        RSS(ref_interp_enclosing_tri_in_list(
                ref_interp, ref_list, ref_node_xyz_ptr(ref_node, node),
                &(ref_interp->cell[node]), &(ref_interp->bary[4 * node])),
            "best tri in list");
      } else {
        RSS(ref_interp_enclosing_tet_in_list(
                ref_interp, ref_list, ref_node_xyz_ptr(ref_node, node),
                &(ref_interp->cell[node]), &(ref_interp->bary[4 * node])),
            "best tet in list");
      }
    }
    RSS(ref_list_free(ref_list), "free list");
  }

  if (REF_EMPTY == ref_interp->cell[node]) {
    return REF_NOT_FOUND;
  }
  return REF_SUCCESS;
}